

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IsFlat
          (CordRepBtree *this,size_t offset,size_t n,string_view *fragment)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  CordRep *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  CordRepBtree *pCVar10;
  CordRep *pCVar11;
  ulong uVar12;
  CordRepBtree *pCVar13;
  
  uVar12 = (this->super_CordRep).length;
  uVar3 = uVar12 - n;
  if (uVar12 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d7,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (uVar3 < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d8,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (n == 0) {
    bVar2 = 0;
  }
  else {
    uVar4 = (uint)(this->super_CordRep).storage[0];
    do {
      if ((this->super_CordRep).length <= offset) {
        __assert_fail("offset < length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x329,
                      "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                     );
      }
      uVar9 = (ulong)(this->super_CordRep).storage[1];
      uVar12 = this->edges_[uVar9]->length;
      uVar6 = offset;
      uVar8 = uVar9;
      uVar7 = uVar9;
      if (uVar12 <= offset) {
        do {
          uVar6 = uVar6 - uVar12;
          uVar8 = uVar7 + 1;
          uVar12 = this->edges_[uVar7 + 1]->length;
          uVar7 = uVar8;
        } while (uVar12 <= uVar6);
      }
      if (uVar8 < uVar9) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((this->super_CordRep).storage[2] <= uVar8) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      pCVar10 = (CordRepBtree *)this->edges_[uVar8];
      uVar12 = (pCVar10->super_CordRep).length;
      if (uVar12 < uVar6 + n) {
        bVar1 = false;
        uVar3 = 0;
      }
      else if ((int)uVar4 < 1) {
        uVar3 = 1;
        if (fragment != (string_view *)0x0) {
          bVar2 = (pCVar10->super_CordRep).tag;
          if (bVar2 < 5) {
            pCVar13 = pCVar10;
            if (bVar2 == 1) {
              pCVar13 = (CordRepBtree *)pCVar10->edges_[1];
            }
            if ((pCVar13->super_CordRep).tag < 5) {
              __assert_fail("IsDataEdge(edge)",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                            ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)"
                           );
            }
          }
          if (bVar2 == 1) {
            pCVar5 = pCVar10->edges_[0];
            pCVar10 = (CordRepBtree *)pCVar10->edges_[1];
          }
          else {
            pCVar5 = (CordRep *)0x0;
          }
          bVar2 = (pCVar10->super_CordRep).tag;
          if (bVar2 < 6) {
            if (bVar2 != 5) {
              __assert_fail("IsExternal()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0x38a,
                            "const CordRepExternal *absl::cord_internal::CordRep::external() const")
              ;
            }
            pCVar11 = pCVar10->edges_[0];
          }
          else {
            if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
            }
            pCVar11 = (CordRep *)(pCVar10->super_CordRep).storage;
          }
          if (uVar12 < uVar6) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar6,uVar12);
          }
          uVar8 = uVar12 - uVar6;
          if (n <= uVar12 - uVar6) {
            uVar8 = n;
          }
          fragment->_M_len = uVar8;
          fragment->_M_str = (char *)(pCVar5->storage + (long)(pCVar11->storage + (uVar6 - 0x1a)));
        }
        bVar1 = false;
        uVar4 = uVar4 - 1;
      }
      else {
        bVar1 = true;
        offset = uVar6;
        this = pCVar10;
        uVar4 = uVar4 - 1;
        if ((pCVar10->super_CordRep).tag != '\x03') {
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
      }
      bVar2 = (byte)uVar3;
    } while (bVar1);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool CordRepBtree::IsFlat(size_t offset, const size_t n,
                          absl::string_view* fragment) const {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return false;
  int height = this->height();
  const CordRepBtree* node = this;
  for (;;) {
    const Position front = node->IndexOf(offset);
    const CordRep* edge = node->Edge(front.index);
    if (edge->length < front.n + n) return false;
    if (--height < 0) {
      if (fragment) *fragment = EdgeData(edge).substr(front.n, n);
      return true;
    }
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}